

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessorTests.cpp
# Opt level: O3

void __thiscall
solitaire::events::EventsProcessorTests::acceptLeftButtonDownOnTableauPileCard
          (EventsProcessorTests *this,PileId *id,uint cardIndex,MouseLeftButtonDown *event)

{
  uint uVar1;
  TypedExpectation<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>
  *this_00;
  ActionInterface<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>
  *impl;
  TypedExpectation<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)> *this_01;
  ActionInterface<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)> *impl_00;
  _Any_data _Stack_98;
  code *local_88;
  uint *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  MatcherBase<const_solitaire::geometry::Position_&> local_68;
  MockSpec<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)> local_50;
  PileId local_2c;
  
  local_2c = (PileId)id->t;
  testing::Matcher<solitaire::piles::PileId>::Matcher
            ((Matcher<solitaire::piles::PileId> *)&local_68,&local_2c);
  ContextMock::gmock_getTableauPileCollider
            ((MockSpec<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>
              *)&local_50,&(this->contextMock).super_ContextMock,
             (Matcher<solitaire::piles::PileId> *)&local_68);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>
            ::InternalExpectedAt
                      ((MockSpec<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>
                        *)&local_50,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                       ,0x74,"contextMock","getTableauPileCollider(id)");
  impl = (ActionInterface<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>
          *)operator_new(0x10);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_00322a88;
  impl[1]._vptr_ActionInterface = (_func_int **)&this->tableauPileColliderMock;
  testing::Action<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>
  ::Action((Action<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>
            *)&_Stack_98,impl);
  testing::internal::
  TypedExpectation<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>
  ::WillOnce(this_00,(Action<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>
                      *)&_Stack_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&_Stack_98,&_Stack_98,__destroy_functor);
  }
  testing::internal::MatcherBase<solitaire::piles::PileId>::~MatcherBase
            ((MatcherBase<solitaire::piles::PileId> *)&local_50.matchers_);
  testing::internal::MatcherBase<solitaire::piles::PileId>::~MatcherBase
            ((MatcherBase<solitaire::piles::PileId> *)&local_68);
  testing::Matcher<const_solitaire::geometry::Position_&>::Matcher
            ((Matcher<const_solitaire::geometry::Position_&> *)&local_68,&event->position);
  colliders::TableauPileColliderMock::gmock_tryGetCollidedCardIndex
            (&local_50,&(this->tableauPileColliderMock).super_TableauPileColliderMock,
             (Matcher<const_solitaire::geometry::Position_&> *)&local_68);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)>::
            InternalExpectedAt(&local_50,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                               ,0x76,"tableauPileColliderMock",
                               "tryGetCollidedCardIndex(event.position)");
  local_78 = (uint *)operator_new(4);
  *local_78 = cardIndex;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<unsigned_int*>(&local_70,local_78)
  ;
  impl_00 = (ActionInterface<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)> *)
            operator_new(0x18);
  impl_00->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_00322e28;
  uVar1 = *local_78;
  *(uint *)&impl_00[1]._vptr_ActionInterface = uVar1;
  *(ulong *)((long)&impl_00[1]._vptr_ActionInterface + 4) = (ulong)uVar1 | 0x100000000;
  testing::Action<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)>::Action
            ((Action<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)> *)
             &_Stack_98,impl_00);
  testing::internal::
  TypedExpectation<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)>::WillOnce
            (this_01,(Action<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)> *)
                     &_Stack_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&_Stack_98,&_Stack_98,__destroy_functor);
  }
  if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
  }
  testing::internal::MatcherBase<const_solitaire::geometry::Position_&>::~MatcherBase
            ((MatcherBase<const_solitaire::geometry::Position_&> *)&local_50.matchers_);
  testing::internal::MatcherBase<const_solitaire::geometry::Position_&>::~MatcherBase(&local_68);
  return;
}

Assistant:

void acceptLeftButtonDownOnTableauPileCard(
        const PileId id, const unsigned cardIndex, const MouseLeftButtonDown& event)
    {
        EXPECT_CALL(contextMock, getTableauPileCollider(id))
            .WillOnce(ReturnRef(tableauPileColliderMock));
        EXPECT_CALL(tableauPileColliderMock, tryGetCollidedCardIndex(event.position))
            .WillOnce(Return(cardIndex));
    }